

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alcmain.h
# Opt level: O0

ALuint __thiscall ALCdevice::channelsFromFmt(ALCdevice *this)

{
  uint uVar1;
  long in_RDI;
  
  uVar1 = ChannelsFromDevFmt(*(DevFmtChannels *)(in_RDI + 0x18),*(uint *)(in_RDI + 0x1c));
  return uVar1;
}

Assistant:

ALuint channelsFromFmt() const noexcept { return ChannelsFromDevFmt(FmtChans, mAmbiOrder); }